

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_putfield(ExecutionEngine *this)

{
  cp_info *constantPool_00;
  CONSTANT_Long_info CVar1;
  ClassInstance *this_00;
  int iVar2;
  VMStack *this_01;
  Frame *this_02;
  cp_info **ppcVar3;
  u1 *puVar4;
  char *pcVar5;
  undefined1 *puVar6;
  Value VVar7;
  string local_178 [32];
  undefined8 local_158;
  anon_union_8_10_52016fac_for_data aStack_150;
  ClassInstance *local_140;
  ClassInstance *classInstance;
  Object *object;
  Value objectValue;
  undefined8 uStack_110;
  Value valueToBeInserted;
  string local_f8 [8];
  string fieldDescriptor;
  allocator local_d1;
  string local_d0 [8];
  string fieldName;
  u2 local_ac;
  u2 uStack_aa;
  char cStack_a8;
  CONSTANT_NameAndType_info fieldNameAndType;
  cp_info nameAndTypeCP;
  allocator local_79;
  string local_78 [8];
  string className;
  u2 local_54;
  ushort uStack_52;
  char cStack_50;
  CONSTANT_Fieldref_info fieldRef;
  cp_info fieldCP;
  uint16_t fieldIndex;
  u1 byte2;
  u1 byte1;
  u1 *code;
  cp_info *constantPool;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_01 = VMStack::getInstance();
  this_02 = VMStack::getTopFrame(this_01);
  ppcVar3 = Frame::getConstantPool(this_02);
  constantPool_00 = *ppcVar3;
  puVar4 = Frame::getCode(this_02,this_02->pc);
  fieldCP.info._14_2_ = CONCAT11(puVar4[1],puVar4[2]);
  CVar1 = constantPool_00[(int)(CONCAT22(0,fieldCP.info._14_2_) - 1)].info.long_info;
  cStack_50 = (char)*(undefined8 *)(constantPool_00 + (int)(CONCAT22(0,fieldCP.info._14_2_) - 1));
  if (cStack_50 != '\t') {
    __assert_fail("fieldCP.tag == CONSTANT_Fieldref",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xeb8,"void ExecutionEngine::i_putfield()");
  }
  local_54 = (u2)CVar1.high_bytes;
  pcVar5 = getFormattedConstant(constantPool_00,local_54);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,pcVar5,&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  uStack_52 = CVar1.high_bytes._2_2_;
  CVar1 = constantPool_00[(int)(uStack_52 - 1)].info.long_info;
  cStack_a8 = (char)*(undefined8 *)(constantPool_00 + (int)(uStack_52 - 1));
  if (cStack_a8 == '\f') {
    local_ac = (u2)CVar1.high_bytes;
    pcVar5 = getFormattedConstant(constantPool_00,local_ac);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,pcVar5,&local_d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    uStack_aa = CVar1.high_bytes._2_2_;
    pcVar5 = getFormattedConstant(constantPool_00,uStack_aa);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,pcVar5,(allocator *)((long)&valueToBeInserted.data + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&valueToBeInserted.data + 7));
    VVar7 = Frame::popTopOfOperandStack(this_02);
    valueToBeInserted._0_8_ = VVar7.data;
    uStack_110._4_4_ = VVar7.type;
    uStack_110 = VVar7._0_8_;
    if ((uStack_110._4_4_ == DOUBLE) || (uStack_110._4_4_ == LONG)) {
      VVar7 = Frame::popTopOfOperandStack(this_02);
      objectValue.data.longValue = VVar7._0_8_;
    }
    else {
      puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_f8);
      switch(*puVar6) {
      case 0x42:
        uStack_110 = 0x100000001;
        break;
      case 0x43:
        uStack_110 = 0x200000002;
        break;
      case 0x53:
        uStack_110 = 0x300000003;
        break;
      case 0x5a:
        uStack_110 = 0;
      }
    }
    VVar7 = Frame::popTopOfOperandStack(this_02);
    classInstance = (ClassInstance *)VVar7.data;
    object._4_4_ = VVar7.type;
    object = VVar7._0_8_;
    objectValue._0_8_ = classInstance;
    if (object._4_4_ == REFERENCE) {
      iVar2 = (**((Object *)classInstance)->_vptr_Object)();
      this_00 = classInstance;
      if (iVar2 == 0) {
        local_140 = classInstance;
        local_158 = uStack_110;
        aStack_150 = (anon_union_8_10_52016fac_for_data)valueToBeInserted._0_8_;
        std::__cxx11::string::string(local_178,local_d0);
        VVar7.data.longValue = aStack_150.longValue;
        VVar7.printType = (undefined4)local_158;
        VVar7.type = local_158._4_4_;
        ClassInstance::putValueIntoField(this_00,VVar7,(string *)local_178);
        std::__cxx11::string::~string(local_178);
        this_02->pc = this_02->pc + 3;
        std::__cxx11::string::~string(local_f8);
        std::__cxx11::string::~string(local_d0);
        std::__cxx11::string::~string(local_78);
        return;
      }
      __assert_fail("object->objectType() == ObjectType::CLASS_INSTANCE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                    ,0xee1,"void ExecutionEngine::i_putfield()");
    }
    __assert_fail("objectValue.type == ValueType::REFERENCE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xedf,"void ExecutionEngine::i_putfield()");
  }
  __assert_fail("nameAndTypeCP.tag == CONSTANT_NameAndType",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0xebf,"void ExecutionEngine::i_putfield()");
}

Assistant:

void ExecutionEngine::i_putfield() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
    cp_info *constantPool = *(topFrame->getConstantPool());
    u1 *code = topFrame->getCode(topFrame->pc);

    u1 byte1 = code[1];
    u1 byte2 = code[2];

    uint16_t fieldIndex = (byte1 << 8) | byte2;
    cp_info fieldCP = constantPool[fieldIndex-1];
    assert(fieldCP.tag == CONSTANT_Fieldref); // precisa ser um fieldRef

    CONSTANT_Fieldref_info fieldRef = fieldCP.info.fieldref_info;

    string className = getFormattedConstant(constantPool, fieldRef.class_index);

    cp_info nameAndTypeCP = constantPool[fieldRef.name_and_type_index-1];
    assert(nameAndTypeCP.tag == CONSTANT_NameAndType); // precisa ser um nameAndType

    CONSTANT_NameAndType_info fieldNameAndType = nameAndTypeCP.info.nameAndType_info;

    string fieldName = getFormattedConstant(constantPool, fieldNameAndType.name_index);
    string fieldDescriptor = getFormattedConstant(constantPool, fieldNameAndType.descriptor_index);

    Value valueToBeInserted = topFrame->popTopOfOperandStack();
    if (valueToBeInserted.type == ValueType::DOUBLE || valueToBeInserted.type == ValueType::LONG) {
        topFrame->popTopOfOperandStack(); // removendo padding
    } else {
        switch (fieldDescriptor[0]) {
            case 'B':
                valueToBeInserted.type = ValueType::BYTE;
                valueToBeInserted.printType = ValueType::BYTE;
                break;
            case 'C':
                valueToBeInserted.type = ValueType::CHAR;
                valueToBeInserted.printType = ValueType::CHAR;
                break;
            case 'S':
                valueToBeInserted.type = ValueType::SHORT;
                valueToBeInserted.printType = ValueType::SHORT;
                break;
            case 'Z':
                valueToBeInserted.type = ValueType::BOOLEAN;
                valueToBeInserted.printType = ValueType::BOOLEAN;
                break;
        }
    }

    Value objectValue = topFrame->popTopOfOperandStack();
    assert(objectValue.type == ValueType::REFERENCE);
    Object *object = objectValue.data.object;
    assert(object->objectType() == ObjectType::CLASS_INSTANCE);
    ClassInstance *classInstance = (ClassInstance *) object;

    classInstance->putValueIntoField(valueToBeInserted, fieldName);

    topFrame->pc += 3;
}